

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-batched.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  gpt2_batch batch_00;
  gpt2_batch batch_01;
  gpt2_batch batch_02;
  FILE *__stream;
  bool bVar1;
  id iVar2;
  time_t tVar3;
  ulong uVar4;
  undefined8 uVar5;
  unsigned_long *puVar6;
  ggml_cgraph *pgVar7;
  undefined8 uVar8;
  size_type sVar9;
  reference pvVar10;
  int *piVar11;
  uint *puVar12;
  float *pfVar13;
  double top_p_00;
  long lVar14;
  mapped_type *pmVar15;
  reference this;
  undefined8 uVar16;
  int8_t *piVar17;
  undefined1 auVar18 [16];
  int64_t t_main_end_us;
  int32_t i_4;
  int ret_code;
  int64_t t_start_us_1;
  mapped_type *token;
  int64_t t_start_sample_us;
  id id;
  float *logits_i;
  int32_t i_3;
  float temp;
  float top_p;
  int top_k;
  int n_vocab;
  int n_decoded;
  int n_len;
  int n_cur;
  vector<int,_std::allocator<int>_> i_batch;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  streams;
  int i_2;
  int32_t i_1;
  int32_t i;
  vector<float,_std::allocator<float>_> logits;
  int64_t t_predict_us;
  int64_t t_sample_us;
  size_t mem_size;
  ggml_cgraph *gf;
  ggml_gallocr_t allocr;
  gpt2_batch batch;
  int n_batch_max;
  int n_parallel;
  vector<int,_std::allocator<int>_> embd_inp;
  int64_t t_start_us;
  gpt2_model model;
  gpt_vocab vocab;
  int64_t t_load_us;
  mt19937 rng;
  gpt_params params;
  int64_t t_main_start_us;
  result_type in_stack_ffffffffffffe6e8;
  int32_t in_stack_ffffffffffffe6f0;
  int32_t iVar19;
  int32_t in_stack_ffffffffffffe6f4;
  int32_t iVar20;
  allocator_type *__a;
  gpt2_pos p1;
  gpt2_pos p0;
  gpt2_seq_id seq_id_dst;
  gpt2_seq_id seq_id_src;
  gpt2_kv_cache *cache;
  int8_t *piVar21;
  key_type *in_stack_ffffffffffffe728;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffe730;
  gpt_params *in_stack_ffffffffffffe740;
  mt19937 *in_stack_ffffffffffffe778;
  string *in_stack_ffffffffffffe7e8;
  gpt_vocab *in_stack_ffffffffffffe7f0;
  vector<float,_std::allocator<float>_> *in_stack_ffffffffffffe830;
  undefined8 in_stack_ffffffffffffe838;
  ggml_gallocr_t in_stack_ffffffffffffe840;
  gpt2_model *in_stack_ffffffffffffe848;
  undefined4 in_stack_ffffffffffffe860;
  undefined4 in_stack_ffffffffffffe864;
  uint uVar22;
  undefined8 in_stack_ffffffffffffe868;
  undefined8 in_stack_ffffffffffffe870;
  undefined8 in_stack_ffffffffffffe878;
  undefined8 in_stack_ffffffffffffe880;
  int8_t *in_stack_ffffffffffffe888;
  mt19937 *in_stack_ffffffffffffe8a8;
  mapped_type *in_stack_ffffffffffffe8b0;
  int top_k_00;
  uint uVar23;
  undefined4 uVar24;
  uint local_171c;
  uint local_1714;
  vector<int,_std::allocator<int>_> local_1708;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16e8;
  int local_16cc [4];
  int local_16bc;
  undefined8 local_16b8;
  string *in_stack_ffffffffffffe970;
  undefined4 in_stack_ffffffffffffe978;
  undefined4 in_stack_ffffffffffffe97c;
  int iVar25;
  long local_1668;
  long local_1660;
  int local_1640;
  undefined4 uStack_163c;
  long lStack_1638;
  undefined7 local_1630;
  undefined1 in_stack_ffffffffffffe9d7;
  gpt2_batch *in_stack_ffffffffffffe9d8;
  gpt2_model *in_stack_ffffffffffffe9e0;
  gpt2_kv_cache *pgStack_1618;
  unsigned_long local_1610;
  size_type local_1608;
  undefined4 local_1600;
  uint local_15fc;
  vector<int,_std::allocator<int>_> local_15f8;
  long local_15e0;
  int local_15d8;
  int local_15d4;
  undefined8 local_1540;
  undefined8 local_1538;
  undefined8 local_1530;
  undefined8 local_1528;
  long local_1478;
  string local_1470 [160];
  gpt_params *in_stack_ffffffffffffec30;
  char **in_stack_ffffffffffffec38;
  int in_stack_ffffffffffffec44;
  int in_stack_fffffffffffff500;
  int in_stack_fffffffffffff504;
  gpt_vocab *in_stack_fffffffffffff508;
  gpt2_model *in_stack_fffffffffffff510;
  string *in_stack_fffffffffffff518;
  uint local_b8;
  int local_b0;
  uint local_ac;
  byte local_9c;
  undefined4 local_90;
  string local_60 [72];
  long local_18;
  int local_4;
  
  local_4 = 0;
  ggml_time_init();
  local_18 = ggml_time_us();
  gpt_params::gpt_params(in_stack_ffffffffffffe740);
  bVar1 = gpt_params_parse(in_stack_ffffffffffffec44,in_stack_ffffffffffffec38,
                           in_stack_ffffffffffffec30);
  if (bVar1) {
    if ((int)local_b8 < 0) {
      tVar3 = time((time_t *)0x0);
      local_b8 = (uint)tVar3;
    }
    printf("%s: seed = %d\n","main",(ulong)local_b8);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0),
               in_stack_ffffffffffffe6e8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      gpt_random_prompt_abi_cxx11_(in_stack_ffffffffffffe778);
      std::__cxx11::string::operator=(local_60,local_1470);
      std::__cxx11::string::~string(local_1470);
    }
    local_1478 = 0;
    gpt_vocab::gpt_vocab((gpt_vocab *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0))
    ;
    gpt2_model::gpt2_model
              ((gpt2_model *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
    local_15e0 = ggml_time_us();
    bVar1 = gpt2_model_load(in_stack_fffffffffffff518,in_stack_fffffffffffff510,
                            in_stack_fffffffffffff508,in_stack_fffffffffffff504,
                            in_stack_fffffffffffff500);
    __stream = _stderr;
    if (bVar1) {
      local_1478 = ggml_time_us();
      local_1478 = local_1478 - local_15e0;
      test_gpt_tokenizer(in_stack_ffffffffffffe7f0,in_stack_ffffffffffffe7e8);
      gpt_tokenize((gpt_vocab *)CONCAT44(in_stack_ffffffffffffe97c,in_stack_ffffffffffffe978),
                   in_stack_ffffffffffffe970);
      local_15fc = local_ac;
      local_1608 = std::vector<int,_std::allocator<int>_>::size(&local_15f8);
      local_1610 = (unsigned_long)(int)local_15fc;
      puVar6 = std::max<unsigned_long>(&local_1608,&local_1610);
      local_1600 = (undefined4)*puVar6;
      gpt2_batch_init(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0);
      uVar5 = ggml_backend_get_default_buffer_type(local_1530);
      uVar5 = ggml_gallocr_new(uVar5);
      pgVar7 = gpt2_graph(in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8,
                          (bool)in_stack_ffffffffffffe9d7);
      ggml_gallocr_reserve(uVar5,pgVar7);
      uVar8 = ggml_gallocr_get_buffer_size(uVar5,0);
      auVar18._8_4_ = (int)((ulong)uVar8 >> 0x20);
      auVar18._0_8_ = uVar8;
      auVar18._12_4_ = 0x45300000;
      fprintf(_stderr,"%s: compute buffer size: %.2f MB\n",
              (((auVar18._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) / 1024.0) / 1024.0,
              "main");
      local_1660 = 0;
      local_1668 = 0;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)0x11664f);
      sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_15f8);
      local_1714 = (uint)sVar9;
      for (iVar25 = 0; iVar25 < (int)local_1714; iVar25 = iVar25 + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_15f8,(long)iVar25);
        *(value_type *)(lStack_1638 + (long)iVar25 * 4) = *pvVar10;
        (&in_stack_ffffffffffffe9d8->n_tokens)[iVar25] = iVar25;
        (&(in_stack_ffffffffffffe9e0->hparams).n_vocab)[iVar25] = 0;
        *(undefined1 *)((long)&pgStack_1618->k + (long)iVar25) = 0;
      }
      *(undefined1 *)((long)&pgStack_1618->k + (long)(int)(local_1714 - 1)) = 1;
      local_16b8 = CONCAT44(uStack_163c,local_1714);
      __a = (allocator_type *)CONCAT17(in_stack_ffffffffffffe9d7,local_1630);
      seq_id_dst = (gpt2_seq_id)in_stack_ffffffffffffe9e0;
      seq_id_src = (gpt2_seq_id)((ulong)in_stack_ffffffffffffe9e0 >> 0x20);
      p1 = (gpt2_pos)in_stack_ffffffffffffe9d8;
      p0 = (gpt2_pos)((ulong)in_stack_ffffffffffffe9d8 >> 0x20);
      iVar19 = (int32_t)lStack_1638;
      iVar20 = (int32_t)((ulong)lStack_1638 >> 0x20);
      batch_01._4_4_ = in_stack_ffffffffffffe864;
      batch_01.n_tokens = in_stack_ffffffffffffe860;
      batch_01.token = (id *)in_stack_ffffffffffffe868;
      batch_01.embd = (float *)in_stack_ffffffffffffe870;
      batch_01.pos = (gpt2_pos *)in_stack_ffffffffffffe878;
      batch_01.seq_id = (gpt2_seq_id *)in_stack_ffffffffffffe880;
      batch_01.logits = in_stack_ffffffffffffe888;
      in_stack_ffffffffffffe6f0 = iVar19;
      in_stack_ffffffffffffe6f4 = iVar20;
      cache = pgStack_1618;
      iVar25 = gpt2_decode(in_stack_ffffffffffffe848,in_stack_ffffffffffffe840,batch_01,
                           (int)((ulong)in_stack_ffffffffffffe838 >> 0x20),in_stack_ffffffffffffe830
                          );
      if (iVar25 == 0) {
        for (local_16bc = 1; local_16bc < (int)local_15fc; local_16bc = local_16bc + 1) {
          gpt2_kv_cache_seq_cp(cache,seq_id_src,seq_id_dst,p0,p1);
        }
        if (1 < (int)local_15fc) {
          printf("\n\n%s: generating %d sequences ...\n","main",(ulong)local_15fc);
        }
        sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_15f8);
        local_16cc[3] = local_15d4 - (int)sVar9;
        piVar11 = std::min<int>(&local_b0,local_16cc + 3);
        local_b0 = *piVar11;
        uVar8 = std::__cxx11::string::c_str();
        printf("%s: prompt: \'%s\'\n","main",uVar8);
        sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_15f8);
        printf("%s: number of tokens in prompt = %zu, first 8 tokens: ","main",sVar9);
        local_16cc[2] = 0;
        while( true ) {
          iVar25 = local_16cc[2];
          local_16cc[1] = 8;
          sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_15f8);
          local_16cc[0] = (int)sVar9;
          piVar11 = std::min<int>(local_16cc + 1,local_16cc);
          if (*piVar11 <= iVar25) break;
          puVar12 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                      (&local_15f8,(long)local_16cc[2]);
          printf("%d ",(ulong)*puVar12);
          local_16cc[2] = local_16cc[2] + 1;
        }
        printf("\n\n");
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)0x116a28);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)cache,CONCAT44(seq_id_src,seq_id_dst),(allocator_type *)CONCAT44(p0,p1));
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)0x116a54);
        std::allocator<int>::allocator((allocator<int> *)0x116a89);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)cache,CONCAT44(seq_id_src,seq_id_dst),
                   (value_type_conflict2 *)CONCAT44(p0,p1),__a);
        std::allocator<int>::~allocator((allocator<int> *)0x116abd);
        iVar25 = local_1714 + local_b0;
        local_171c = 0;
        uVar24 = local_90;
        while ((int)local_1714 < iVar25) {
          local_1640 = 0;
          for (uVar23 = 0; (int)uVar23 < (int)local_15fc; uVar23 = uVar23 + 1) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                (&local_1708,(long)(int)uVar23);
            if (-1 < *pvVar10) {
              pfVar13 = std::vector<float,_std::allocator<float>_>::data
                                  ((vector<float,_std::allocator<float>_> *)0x116be1);
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  (&local_1708,(long)(int)uVar23);
              pfVar13 = pfVar13 + *pvVar10 * local_15d8;
              top_k_00 = 0;
              top_p_00 = (double)ggml_time_us();
              iVar2 = gpt_sample_top_k_top_p
                                ((gpt_vocab *)CONCAT44(uVar24,uVar23),pfVar13,top_k_00,top_p_00,
                                 (double)in_stack_ffffffffffffe8b0,in_stack_ffffffffffffe8a8);
              lVar14 = ggml_time_us();
              local_1660 = (lVar14 - (long)top_p_00) + local_1660;
              if ((((local_9c & 1) == 0) && (iVar2 == 0xc450)) || (local_1714 == iVar25 - 1U)) {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_1708,(long)(int)uVar23);
                *pvVar10 = -1;
                printf("\n");
                if (1 < (int)local_15fc) {
                  printf("%s: stream %d finished at n_cur = %d","main",(ulong)uVar23,
                         (ulong)local_1714);
                }
              }
              else {
                pmVar15 = std::
                          map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](in_stack_ffffffffffffe730,in_stack_ffffffffffffe728);
                if (local_15fc == 1) {
                  uVar8 = std::__cxx11::string::c_str();
                  printf("%s",uVar8);
                  fflush(_stdout);
                }
                in_stack_ffffffffffffe8b0 = pmVar15;
                this = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[](&local_16e8,(long)(int)uVar23);
                std::__cxx11::string::operator+=((string *)this,(string *)pmVar15);
                *(id *)(lStack_1638 + (long)local_1640 * 4) = iVar2;
                (&in_stack_ffffffffffffe9d8->n_tokens)[local_1640] = local_1714;
                (&(in_stack_ffffffffffffe9e0->hparams).n_vocab)[local_1640] = uVar23;
                *(undefined1 *)((long)&pgStack_1618->k + (long)local_1640) = 1;
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    (&local_1708,(long)(int)uVar23);
                *pvVar10 = local_1640;
                local_1640 = local_1640 + 1;
                local_171c = local_171c + 1;
              }
            }
          }
          if (local_1640 == 0) break;
          local_1714 = local_1714 + 1;
          in_stack_ffffffffffffe8a8 = (mt19937 *)ggml_time_us();
          batch_02.token._4_4_ = uStack_163c;
          batch_02.token._0_4_ = local_1640;
          batch_02.pos._7_1_ = in_stack_ffffffffffffe9d7;
          batch_02.pos._0_7_ = local_1630;
          p1 = (gpt2_pos)in_stack_ffffffffffffe9d8;
          p0 = (gpt2_pos)((ulong)in_stack_ffffffffffffe9d8 >> 0x20);
          batch_02._4_4_ = in_stack_ffffffffffffe864;
          batch_02.n_tokens = in_stack_ffffffffffffe860;
          batch_02.embd = (float *)lStack_1638;
          batch_02.seq_id = &in_stack_ffffffffffffe9d8->n_tokens;
          batch_02.logits = (int8_t *)in_stack_ffffffffffffe9e0;
          in_stack_ffffffffffffe6f0 = iVar19;
          in_stack_ffffffffffffe6f4 = iVar20;
          uVar23 = gpt2_decode(in_stack_ffffffffffffe848,in_stack_ffffffffffffe840,batch_02,
                               (int)((ulong)in_stack_ffffffffffffe838 >> 0x20),
                               in_stack_ffffffffffffe830);
          if (uVar23 != 0) {
            fprintf(_stderr,"%s : failed to eval, return code %d\n","main",(ulong)uVar23);
            local_4 = 1;
            goto LAB_00117291;
          }
          in_stack_ffffffffffffe730 =
               (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)ggml_time_us();
          local_1668 = (long)in_stack_ffffffffffffe730 +
                       (local_1668 - (long)in_stack_ffffffffffffe8a8);
        }
        if (1 < (int)local_15fc) {
          printf("\n");
          uVar23 = 0;
          while ((int)uVar23 < (int)local_15fc) {
            uVar22 = uVar23;
            uVar8 = std::__cxx11::string::c_str();
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_16e8,(long)(int)uVar22);
            uVar16 = std::__cxx11::string::c_str();
            printf("sequence %d:\n\n%s%s\n\n",(ulong)uVar23,uVar8,uVar16);
            uVar23 = uVar22 + 1;
          }
        }
        piVar17 = (int8_t *)ggml_time_us();
        piVar21 = piVar17;
        printf("\n\n");
        printf("%s:     n_decoded = %8d\n","main",(ulong)local_171c);
        printf("%s:     load time = %8.2f ms\n",(double)((float)local_1478 / 1000.0),"main");
        printf("%s:   sample time = %8.2f ms\n",(double)((float)local_1660 / 1000.0),"main");
        printf("%s:  predict time = %8.2f ms\n",(double)((float)local_1668 / 1000.0),"main");
        printf("%s:    total time = %8.2f ms\n",(double)((float)((long)piVar17 - local_18) / 1000.0)
               ,"main");
        batch_00.token._7_1_ = in_stack_ffffffffffffe9d7;
        batch_00.token._0_7_ = local_1630;
        p1 = (gpt2_pos)in_stack_ffffffffffffe9d8;
        p0 = (gpt2_pos)((ulong)in_stack_ffffffffffffe9d8 >> 0x20);
        batch_00._0_8_ = lStack_1638;
        batch_00.embd._0_4_ = p1;
        batch_00.embd._4_4_ = p0;
        batch_00.pos._0_4_ = (int)in_stack_ffffffffffffe9e0;
        batch_00.pos._4_4_ = (int)((ulong)in_stack_ffffffffffffe9e0 >> 0x20);
        batch_00.seq_id = (gpt2_seq_id *)pgStack_1618;
        batch_00.logits = piVar21;
        gpt2_batch_free(batch_00);
        ggml_free(local_1538);
        ggml_gallocr_free(uVar5);
        ggml_backend_buffer_free(local_1528);
        ggml_backend_buffer_free(local_1540);
        ggml_backend_free(local_1530);
        local_4 = 0;
        in_stack_ffffffffffffe6f0 = iVar19;
        in_stack_ffffffffffffe6f4 = iVar20;
LAB_00117291:
        std::vector<int,_std::allocator<int>_>::~vector
                  ((vector<int,_std::allocator<int>_> *)CONCAT44(p0,p1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT44(p0,p1));
      }
      else {
        printf("%s: gpt2_decode() failed\n","main");
        local_4 = 1;
      }
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)CONCAT44(p0,p1));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)CONCAT44(p0,p1));
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      fprintf(__stream,"%s: failed to load model from \'%s\'\n","main",uVar5);
      local_4 = 1;
    }
    gpt2_model::~gpt2_model
              ((gpt2_model *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
    gpt_vocab::~gpt_vocab
              ((gpt_vocab *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  }
  else {
    local_4 = 1;
  }
  gpt_params::~gpt_params
            ((gpt_params *)CONCAT44(in_stack_ffffffffffffe6f4,in_stack_ffffffffffffe6f0));
  return local_4;
}

Assistant:

int main(int argc, char ** argv) {
    ggml_time_init();

    const int64_t t_main_start_us = ggml_time_us();

    gpt_params params;

    if (gpt_params_parse(argc, argv, params) == false) {
        return 1;
    }

    if (params.seed < 0) {
        params.seed = time(NULL);
    }

    printf("%s: seed = %d\n", __func__, params.seed);

    std::mt19937 rng(params.seed);
    if (params.prompt.empty()) {
        params.prompt = gpt_random_prompt(rng);
    }

    int64_t t_load_us = 0;

    gpt_vocab vocab;
    gpt2_model model;

    // load the model
    {
        const int64_t t_start_us = ggml_time_us();

        if (!gpt2_model_load(params.model, model, vocab, params.n_ctx, params.n_gpu_layers)) {
            fprintf(stderr, "%s: failed to load model from '%s'\n", __func__, params.model.c_str());
            return 1;
        }

        t_load_us = ggml_time_us() - t_start_us;

        test_gpt_tokenizer(vocab, params.token_test);
    }

    // tokenize the prompt
    std::vector<gpt_vocab::id> embd_inp = ::gpt_tokenize(vocab, params.prompt);

    const int n_parallel = params.n_parallel;
    const int n_batch_max = std::max(embd_inp.size(), (size_t)n_parallel);

    // create a gpt2_batch
    // we use this object to submit token data for decoding
    gpt2_batch batch = gpt2_batch_init(n_batch_max, 0);

    // prepare required memory and allocate the compute buffer
    ggml_gallocr_t allocr = NULL;
    {
        // create an allocator to measure the memory usage
        allocr = ggml_gallocr_new(ggml_backend_get_default_buffer_type(model.backend));

        // create the worst case graph for memory usage estimation
        batch.n_tokens = n_batch_max;
        struct ggml_cgraph * gf = gpt2_graph(model, batch, true);

        // pre-allocate the compute buffer for the worst case (optional)
        ggml_gallocr_reserve(allocr, gf);
        size_t mem_size = ggml_gallocr_get_buffer_size(allocr, 0);
        fprintf(stderr, "%s: compute buffer size: %.2f MB\n", __func__, mem_size/1024.0/1024.0);
    }

    int64_t t_sample_us  = 0;
    int64_t t_predict_us = 0;

    std::vector<float> logits;

    // evaluate the initial prompt
    batch.n_tokens = embd_inp.size();

    for (int32_t i = 0; i < batch.n_tokens; i++) {
        batch.token[i]  = embd_inp[i];
        batch.pos[i]    = i;
        batch.seq_id[i] = 0;
        batch.logits[i] = false;
    }

    // gpt2_decode will output logits only for the last token of the prompt
    batch.logits[batch.n_tokens - 1] = true;

    if (gpt2_decode(model, allocr, batch, params.n_threads, logits) != 0) {
        printf("%s: gpt2_decode() failed\n", __func__);
        return 1;
    }

    // assign the system KV cache to all parallel sequences
    // this way, the parallel sequences will "reuse" the prompt tokens without having to copy them
    for (int32_t i = 1; i < n_parallel; ++i) {
        gpt2_kv_cache_seq_cp(model.kv_cache, 0, i, 0, batch.n_tokens);
    }

    if (n_parallel > 1) {
        printf("\n\n%s: generating %d sequences ...\n", __func__, n_parallel);
    }

    params.n_predict = std::min(params.n_predict, model.hparams.n_ctx - (int) embd_inp.size());

    printf("%s: prompt: '%s'\n", __func__, params.prompt.c_str());
    printf("%s: number of tokens in prompt = %zu, first 8 tokens: ", __func__, embd_inp.size());
    for (int i = 0; i < std::min(8, (int) embd_inp.size()); i++) {
        printf("%d ", embd_inp[i]);
    }
    printf("\n\n");

    std::vector<gpt_vocab::token> streams(n_parallel);

    // remember the batch index of the last token for each parallel sequence
    // we need this to determine which logits to sample from
    std::vector<int32_t> i_batch(n_parallel, batch.n_tokens - 1);

    int n_cur     = batch.n_tokens;
    int n_len     = batch.n_tokens + params.n_predict;
    int n_decoded = 0;

    const int   n_vocab = model.hparams.n_vocab;
    const int   top_k = params.top_k;
    const float top_p = params.top_p;
    const float temp  = params.temp;

    while (n_cur < n_len) {
        batch.n_tokens = 0;

        for (int32_t i = 0; i < n_parallel; ++i) {
            if (i_batch[i] < 0) {
                // the stream has already finished
                continue;
            }

            auto * logits_i = logits.data() + i_batch[i]*n_vocab;

            gpt_vocab::id id = 0;
            {
                const int64_t t_start_sample_us = ggml_time_us();

                id = gpt_sample_top_k_top_p(vocab, logits_i, top_k, top_p, temp, rng);

                t_sample_us += ggml_time_us() - t_start_sample_us;
            }

            // is it an end of stream? -> mark the stream as finished
            if ((!params.ignore_eos && id == 50256) || n_cur == n_len - 1) {
                i_batch[i] = -1;
                printf("\n");
                if (n_parallel > 1) {
                    printf("%s: stream %d finished at n_cur = %d", __func__, i, n_cur);
                }

                continue;
            }

            auto& token = vocab.id_to_token[id];
            if (n_parallel == 1) {
                printf("%s", token.c_str());
                fflush(stdout);
            }

            streams[i] += token;

            // push this new token for next evaluation
            batch.token [batch.n_tokens] = id;
            batch.pos   [batch.n_tokens] = n_cur;
            batch.seq_id[batch.n_tokens] = i;
            batch.logits[batch.n_tokens] = true;

            i_batch[i] = batch.n_tokens;

            batch.n_tokens += 1;

            n_decoded += 1;
        }

        // all streams are finished
        if (batch.n_tokens == 0) {
            break;
        }

        n_cur += 1;

        {
            const int64_t t_start_us = ggml_time_us();

            // evaluate the current batch with the transformer model
            int ret_code = gpt2_decode(model, allocr, batch, params.n_threads, logits);
            if (ret_code != 0) {
                fprintf(stderr, "%s : failed to eval, return code %d\n", __func__, ret_code);
                return 1;
            }

            t_predict_us += ggml_time_us() - t_start_us;
        }
    }

    if (n_parallel > 1) {
        printf("\n");

        for (int32_t i = 0; i < n_parallel; ++i) {
            printf("sequence %d:\n\n%s%s\n\n", i, params.prompt.c_str(), streams[i].c_str());
        }
    }

    // report timing
    {
        const int64_t t_main_end_us = ggml_time_us();

        printf("\n\n");
        printf("%s:     n_decoded = %8d\n",      __func__, n_decoded);
        printf("%s:     load time = %8.2f ms\n", __func__, t_load_us/1000.0f);
        printf("%s:   sample time = %8.2f ms\n", __func__, t_sample_us/1000.0f);
        printf("%s:  predict time = %8.2f ms\n", __func__, t_predict_us/1000.0f);
        printf("%s:    total time = %8.2f ms\n", __func__, (t_main_end_us - t_main_start_us)/1000.0f);
    }

    gpt2_batch_free(batch);
    ggml_free(model.ctx_w);

    ggml_gallocr_free(allocr);
    ggml_backend_buffer_free(model.buffer_w);
    ggml_backend_buffer_free(model.kv_cache.buffer);
    ggml_backend_free(model.backend);

    return 0;
}